

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

RELEASED_HANDLE released_clone(RELEASED_HANDLE value)

{
  RELEASED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (RELEASED_HANDLE)malloc(8);
  if (__ptr != (RELEASED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (RELEASED_HANDLE)0x0;
}

Assistant:

RELEASED_HANDLE released_clone(RELEASED_HANDLE value)
{
    RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)malloc(sizeof(RELEASED_INSTANCE));
    if (released_instance != NULL)
    {
        released_instance->composite_value = amqpvalue_clone(((RELEASED_INSTANCE*)value)->composite_value);
        if (released_instance->composite_value == NULL)
        {
            free(released_instance);
            released_instance = NULL;
        }
    }

    return released_instance;
}